

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O3

Array<capnp::word> * __thiscall
capnp::_::StructReader::canonicalize(Array<capnp::word> *__return_storage_ptr__,StructReader *this)

{
  word *__src;
  size_t elementCount;
  word *__s;
  word *__dest;
  size_t sVar1;
  word *ptrCopy;
  MessageSizeCounts MVar2;
  ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> AVar3;
  ArrayPtr<capnp::word> array;
  DebugExpression<bool> _kjCondition;
  Fault f;
  Array<capnp::word> backing;
  FlatMessageBuilder builder;
  DebugExpression<bool> local_141;
  Builder local_140;
  word *local_128;
  size_t sStack_120;
  undefined8 *local_118;
  FlatMessageBuilder local_108;
  
  MVar2 = totalSize(this);
  sVar1 = MVar2.wordCount + 1;
  __s = (word *)kj::_::HeapArrayDisposer::allocateImpl
                          (8,sVar1,sVar1,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0);
  sVar1 = MVar2.wordCount + 1;
  local_118 = &kj::_::HeapArrayDisposer::instance;
  local_128 = __s;
  sStack_120 = sVar1;
  if (sVar1 != 0) {
    memset(__s,0,sVar1 * 8);
  }
  array.size_ = sVar1;
  array.ptr = __s;
  FlatMessageBuilder::FlatMessageBuilder(&local_108,array);
  MessageBuilder::getRootInternal(&local_140,&local_108.super_MessageBuilder);
  WireHelpers::zeroObject
            (local_140.builder.segment,local_140.builder.capTable,local_140.builder.pointer);
  (local_140.builder.pointer)->offsetAndKind = 0;
  (local_140.builder.pointer)->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
  WireHelpers::setStructPointer
            (local_140.builder.segment,local_140.builder.capTable,local_140.builder.pointer,*this,
             (BuilderArena *)0x0,true);
  local_141.value = MessageBuilder::isCanonical(&local_108.super_MessageBuilder);
  if (local_141.value) {
    AVar3 = MessageBuilder::getSegmentsForOutput(&local_108.super_MessageBuilder);
    __src = (AVar3.ptr)->ptr;
    elementCount = (AVar3.ptr)->size_;
    __dest = (word *)kj::_::HeapArrayDisposer::allocateImpl
                               (8,elementCount,elementCount,(_func_void_void_ptr *)0x0,
                                (_func_void_void_ptr *)0x0);
    __return_storage_ptr__->ptr = __dest;
    __return_storage_ptr__->size_ = elementCount;
    __return_storage_ptr__->disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
    if (elementCount != 0) {
      memcpy(__dest,__src,elementCount << 3);
    }
    FlatMessageBuilder::~FlatMessageBuilder(&local_108);
    if (__s != (word *)0x0) {
      local_128 = (word *)0x0;
      sStack_120 = 0;
      kj::_::HeapArrayDisposer::disposeImpl
                ((HeapArrayDisposer *)&kj::_::HeapArrayDisposer::instance,__s,8,sVar1,sVar1,
                 (_func_void_void_ptr *)0x0);
    }
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
            ((Fault *)&local_140,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
             ,0xbb6,FAILED,"builder.isCanonical()","_kjCondition,",&local_141);
  kj::_::Debug::Fault::fatal((Fault *)&local_140);
}

Assistant:

kj::Array<word> StructReader::canonicalize() {
  auto size = totalSize().wordCount + POINTER_SIZE_IN_WORDS;
  kj::Array<word> backing = kj::heapArray<word>(unbound(size / WORDS));
  WireHelpers::zeroMemory(backing.asPtr());
  FlatMessageBuilder builder(backing);
  _::PointerHelpers<AnyPointer>::getInternalBuilder(builder.initRoot<AnyPointer>()).setStruct(*this, true);
  KJ_ASSERT(builder.isCanonical());
  auto output = builder.getSegmentsForOutput()[0];
  kj::Array<word> trunc = kj::heapArray<word>(output.size());
  WireHelpers::copyMemory(trunc.begin(), output);
  return trunc;
}